

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collider.cxx
# Opt level: O2

void __thiscall trento::Collider::Collider(Collider *this,VarMap *var_map)

{
  bool bVar1;
  int iVar2;
  _Head_base<0UL,_trento::Nucleus_*,_false> _Var3;
  Nucleus *pNVar4;
  result_type __sd;
  undefined8 uVar5;
  any *paVar6;
  int *piVar7;
  bool *pbVar8;
  double *pdVar9;
  result_type *prVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  allocator local_59;
  double local_58;
  string local_50 [32];
  
  anon_unknown_6::create_nucleus((anon_unknown_6 *)this,var_map,0);
  anon_unknown_6::create_nucleus((anon_unknown_6 *)&this->nucleusB_,var_map,1);
  NucleonCommon::NucleonCommon(&this->nucleon_common_,var_map);
  std::__cxx11::string::string(local_50,"number-events",&local_59);
  paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  piVar7 = boost::any_cast<int_const&>(paVar6);
  iVar2 = *piVar7;
  std::__cxx11::string::~string(local_50);
  this->nevents_ = iVar2;
  std::__cxx11::string::string(local_50,"ncoll",&local_59);
  paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  pbVar8 = boost::any_cast<bool_const&>(paVar6);
  bVar1 = *pbVar8;
  std::__cxx11::string::~string(local_50);
  this->calc_ncoll_ = bVar1;
  std::__cxx11::string::string(local_50,"b-min",&local_59);
  paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  pdVar9 = boost::any_cast<double_const&>(paVar6);
  local_58 = *pdVar9;
  std::__cxx11::string::~string(local_50);
  this->bmin_ = local_58;
  _Var3._M_head_impl =
       (this->nucleusA_)._M_t.
       super___uniq_ptr_impl<trento::Nucleus,_std::default_delete<trento::Nucleus>_>._M_t.
       super__Tuple_impl<0UL,_trento::Nucleus_*,_std::default_delete<trento::Nucleus>_>.
       super__Head_base<0UL,_trento::Nucleus_*,_false>._M_head_impl;
  pNVar4 = (this->nucleusB_)._M_t.
           super___uniq_ptr_impl<trento::Nucleus,_std::default_delete<trento::Nucleus>_>._M_t.
           super__Tuple_impl<0UL,_trento::Nucleus_*,_std::default_delete<trento::Nucleus>_>.
           super__Head_base<0UL,_trento::Nucleus_*,_false>._M_head_impl;
  std::__cxx11::string::string(local_50,"b-max",&local_59);
  paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  pdVar9 = boost::any_cast<double_const&>(paVar6);
  local_58 = *pdVar9;
  std::__cxx11::string::~string(local_50);
  dVar13 = local_58;
  if (local_58 < 0.0) {
    dVar11 = (double)(**(code **)((long)(_Var3._M_head_impl)->_vptr_Nucleus + 0x10))
                               (_Var3._M_head_impl);
    local_58 = dVar11;
    (*pNVar4->_vptr_Nucleus[2])(pNVar4);
    dVar13 = (this->nucleon_common_).max_impact_sq_;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar13;
    if (dVar13 < 0.0) {
      local_58 = dVar11 + local_58;
      dVar12 = sqrt(dVar13);
      dVar13 = local_58;
    }
    else {
      auVar14 = vsqrtsd_avx(auVar14,auVar14);
      dVar12 = auVar14._0_8_;
      dVar13 = dVar11 + local_58;
    }
    dVar13 = dVar13 + dVar12;
  }
  this->bmax_ = dVar13;
  pNVar4 = (this->nucleusB_)._M_t.
           super___uniq_ptr_impl<trento::Nucleus,_std::default_delete<trento::Nucleus>_>._M_t.
           super__Tuple_impl<0UL,_trento::Nucleus_*,_std::default_delete<trento::Nucleus>_>.
           super__Head_base<0UL,_trento::Nucleus_*,_false>._M_head_impl;
  dVar13 = (double)(**(code **)((long)((this->nucleusA_)._M_t.
                                       super___uniq_ptr_impl<trento::Nucleus,_std::default_delete<trento::Nucleus>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_trento::Nucleus_*,_std::default_delete<trento::Nucleus>_>
                                       .super__Head_base<0UL,_trento::Nucleus_*,_false>._M_head_impl
                                      )->_vptr_Nucleus + 0x10))();
  local_58 = dVar13;
  (*pNVar4->_vptr_Nucleus[2])(pNVar4);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_58 + dVar13;
  uVar5 = vcmpsd_avx512f(auVar15,ZEXT816(0x3fb999999999999a),1);
  bVar1 = (bool)((byte)uVar5 & 1);
  this->asymmetry_ =
       (double)((ulong)bVar1 * 0x3fe0000000000000 +
               (ulong)!bVar1 * (long)(local_58 / (local_58 + dVar13)));
  Event::Event(&this->event_,var_map);
  Output::Output(&this->output_,var_map);
  std::__cxx11::string::string(local_50,"random-seed",&local_59);
  paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  prVar10 = (result_type *)boost::any_cast<long_const&>(paVar6);
  __sd = *prVar10;
  std::__cxx11::string::~string(local_50);
  if (0 < (long)__sd) {
    std::
    mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
    ::seed((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            *)random::engine,__sd);
  }
  return;
}

Assistant:

Collider::Collider(const VarMap& var_map)
    : nucleusA_(create_nucleus(var_map, 0)),
      nucleusB_(create_nucleus(var_map, 1)),
      nucleon_common_(var_map),
      nevents_(var_map["number-events"].as<int>()),
      calc_ncoll_(var_map["ncoll"].as<bool>()),
      bmin_(var_map["b-min"].as<double>()),
      bmax_(determine_bmax(var_map, *nucleusA_, *nucleusB_, nucleon_common_)),
      asymmetry_(determine_asym(*nucleusA_, *nucleusB_)),
      event_(var_map),
      output_(var_map) {
  // Constructor body begins here.
  // Set random seed if requested.
  auto seed = var_map["random-seed"].as<int64_t>();
  if (seed > 0)
    random::engine.seed(static_cast<random::Engine::result_type>(seed));
}